

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Transmitter_PDU::Decode(Transmitter_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 *pKVar1;
  KUINT16 KVar2;
  KException *this_00;
  int iVar3;
  undefined7 in_register_00000011;
  KUINT16 i_1;
  ushort uVar4;
  KUINT8 i;
  byte bVar5;
  allocator<char> local_59;
  KUINT16 *local_58;
  KOCTET o;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x67 < iVar3 + (uint)KVar2) {
    Radio_Communications_Header::Decode
              (&this->super_Radio_Communications_Header,stream,ignoreHeader);
    (*(this->m_RadioEntityType).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_RadioEntityType,stream);
    KDataStream::Read(stream,&this->m_ui8TransmitterState);
    KDataStream::Read(stream,&this->m_ui8InputSource);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
    (*(this->m_AntennaLocation).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AntennaLocation,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16AntennaPatternType);
    local_58 = &this->m_ui16AntennaPatternLength;
    KDataStream::Read<unsigned_short>(stream,local_58);
    KDataStream::Read<unsigned_long_long>(stream,&this->m_ui64Freq);
    KDataStream::Read<float>(stream,(float *)&this->m_f32TransmitFreqBW);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Power);
    (*(this->m_ModulationType).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_ModulationType,stream);
    (*(this->m_CryptoSystem).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_CryptoSystem,stream)
    ;
    KDataStream::Read(stream,&this->m_ui8LengthOfModulationParam);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding2);
    KDataStream::Read(stream,&this->m_ui8Padding3);
    for (bVar5 = 0; pKVar1 = local_58, bVar5 < this->m_ui8LengthOfModulationParam; bVar5 = bVar5 + 1
        ) {
      KDataStream::Read(stream,&o);
      std::vector<char,_std::allocator<char>_>::push_back(&this->m_vModulationParams,&o);
    }
    for (uVar4 = 0; uVar4 < *pKVar1; uVar4 = uVar4 + 1) {
      KDataStream::Read(stream,&o);
      std::vector<char,_std::allocator<char>_>::push_back(&this->m_vAntennaPattern,&o);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&o,"Decode",&local_59);
  KException::KException(this_00,(KString *)&o,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Transmitter_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < TRANSMITTER_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Radio_Communications_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_RadioEntityType
           >> m_ui8TransmitterState
           >> m_ui8InputSource
           >> m_ui16Padding1
           >> KDIS_STREAM m_AntennaLocation
           >> m_ui16AntennaPatternType
           >> m_ui16AntennaPatternLength
           >> m_ui64Freq
           >> m_f32TransmitFreqBW
           >> m_f32Power
           >> KDIS_STREAM m_ModulationType
           >> KDIS_STREAM m_CryptoSystem
           >> m_ui8LengthOfModulationParam
           >> m_ui16Padding2
           >> m_ui8Padding3;

    for( KUINT8 i = 0; i < m_ui8LengthOfModulationParam; ++i )
    {
        KOCTET o;
        stream >> o;
        m_vModulationParams.push_back( o );
    }

    for( KUINT16 i = 0; i < m_ui16AntennaPatternLength; ++i )
    {
        KOCTET o;
        stream >> o;
        m_vAntennaPattern.push_back( o );
    }
}